

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoDeleteTempFile.cpp
# Opt level: O0

void anon_unknown.dwarf_11f19a::DeleteTree(string *path)

{
  pointer ppcVar1;
  long lVar2;
  long lVar3;
  FTSENT *f;
  FTS *tree;
  array<char_*,_2UL> paths;
  allocator_type local_39;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined1 local_28 [8];
  vector<char,_std::allocator<char>_> pathchars;
  string *path_local;
  
  pathchars.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = path;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38._M_current = (char *)std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::vector<char,std::allocator<char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<char,std::allocator<char>> *)local_28,local_30,local_38,&local_39);
  std::allocator<char>::~allocator(&local_39);
  paths._M_elems[1]._3_1_ = 0;
  std::vector<char,_std::allocator<char>_>::push_back
            ((vector<char,_std::allocator<char>_> *)local_28,
             (value_type_conflict *)((long)paths._M_elems + 0xb));
  tree = (FTS *)std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)local_28);
  paths._M_elems[0] = (char *)0x0;
  ppcVar1 = std::array<char_*,_2UL>::data((array<char_*,_2UL> *)&tree);
  lVar2 = fts_open(ppcVar1,0x14,0);
  if (lVar2 != 0) {
    while (lVar3 = fts_read(lVar2), lVar3 != 0) {
      if (*(short *)(lVar3 + 0x62) != 1) {
        remove(*(char **)(lVar3 + 0x28));
      }
    }
    fts_close(lVar2);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_28)
  ;
  return;
}

Assistant:

void DeleteTree(const std::string& path)
{
    // fts_open wants a char* const, not a const char*; therefore, we need
    // a mutable pointer to path. fts promises not to modify it.
    std::vector<char> pathchars(path.begin(), path.end());
    pathchars.push_back(0);

    std::array<char*, 2> paths{pathchars.data(), nullptr};

    FTS* tree = fts_open(paths.data(), FTS_PHYSICAL | FTS_NOCHDIR, nullptr);
    if (!tree) {
        return;
    }

    while (FTSENT* f = fts_read(tree)) {
        switch (f->fts_info) {
            case FTS_D:
                // skip pre-order directory traversal because it's potentially
                // not empty yet
                break;

            default:
                // attempt to delete anything else and ignore errors
                remove(f->fts_accpath);
                break;
        }
    }

    fts_close(tree);
}